

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

Vector3<long_double> *
s2pred::GetCircumcenter<long_double>
          (Vector3<long_double> *__return_storage_ptr__,Vector3<long_double> *a,
          Vector3<long_double> *b,Vector3<long_double> *c,longdouble *error)

{
  D *__return_storage_ptr___00;
  BasicVector<Vector3,_long_double,_3UL> *__return_storage_ptr___01;
  D *__return_storage_ptr___02;
  Vector3<long_double> *__return_storage_ptr___03;
  Vector3<long_double> *__return_storage_ptr___04;
  BasicVector<Vector3,_long_double,_3UL> *this;
  BasicVector<Vector3,_long_double,_3UL> *pBVar1;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  __type_conflict _Var2;
  __type_conflict _Var3;
  undefined1 local_1f8 [8];
  Vector3<long_double> mbc;
  Vector3<long_double> mab;
  longdouble bc_len;
  longdouble nbc_len;
  Vector3<long_double> nbc;
  longdouble ab_len;
  longdouble nab_len;
  Vector3<long_double> nab;
  Vector3<long_double> bc_sum;
  Vector3<long_double> bc_diff;
  Vector3<long_double> ab_sum;
  Vector3<long_double> ab_diff;
  longdouble T_ERR;
  longdouble *error_local;
  Vector3<long_double> *c_local;
  Vector3<long_double> *b_local;
  Vector3<long_double> *a_local;
  
  pBVar1 = (BasicVector<Vector3,_long_double,_3UL> *)((long)ab_sum.c_ + 0x28);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            ((D *)pBVar1,(BasicVector<Vector3,_long_double,_3UL> *)a,b);
  __return_storage_ptr___00 = (D *)((long)bc_diff.c_ + 0x28);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator+
            (__return_storage_ptr___00,(BasicVector<Vector3,_long_double,_3UL> *)a,b);
  __return_storage_ptr___01 = (BasicVector<Vector3,_long_double,_3UL> *)((long)bc_sum.c_ + 0x28);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            ((D *)__return_storage_ptr___01,(BasicVector<Vector3,_long_double,_3UL> *)b,c);
  __return_storage_ptr___02 = (D *)((long)nab.c_ + 0x28);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator+
            (__return_storage_ptr___02,(BasicVector<Vector3,_long_double,_3UL> *)b,c);
  __return_storage_ptr___03 = (Vector3<long_double> *)((long)&nab_len + 8);
  this = pBVar1;
  Vector3<long_double>::CrossProd
            (__return_storage_ptr___03,(Vector3<long_double> *)pBVar1,__return_storage_ptr___00);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm
            ((FloatType *)__return_storage_ptr___03,this);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm
            ((FloatType *)pBVar1,this);
  __return_storage_ptr___04 = (Vector3<long_double> *)((long)&nbc_len + 8);
  pBVar1 = __return_storage_ptr___01;
  unique0x1000020f = in_ST1;
  Vector3<long_double>::CrossProd
            (__return_storage_ptr___04,(Vector3<long_double> *)__return_storage_ptr___01,
             __return_storage_ptr___02);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm
            ((FloatType *)__return_storage_ptr___04,pBVar1);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm
            ((FloatType *)__return_storage_ptr___01,pBVar1);
  Vector3<long_double>::CrossProd
            ((Vector3<long_double> *)((long)mbc.c_ + 0x28),__return_storage_ptr___03,
             __return_storage_ptr___00);
  Vector3<long_double>::CrossProd
            ((Vector3<long_double> *)local_1f8,__return_storage_ptr___04,__return_storage_ptr___02);
  _Var2 = std::sqrt<int>(3);
  _Var3 = std::sqrt<int>(3);
  *error = (longdouble)4.4510473808249057e-67 +
           in_ST2 * in_ST0 * ((longdouble)8.881784e-16 * (in_ST3 + stack0xfffffffffffffeb8) +
                             (longdouble)(_Var2 * 24.0 + 16.0) * (longdouble)5.421011e-20) +
           (in_ST2 + in_ST0) *
           (longdouble)(_Var3 * 128.0 * 1.1102230246251565e-16) * (longdouble)5.421011e-20;
  Vector3<long_double>::CrossProd
            (__return_storage_ptr__,(Vector3<long_double> *)((long)mbc.c_ + 0x28),
             (Vector3<long_double> *)local_1f8);
  return __return_storage_ptr__;
}

Assistant:

Vector3<T> GetCircumcenter(const Vector3<T>& a, const Vector3<T>& b,
                           const Vector3<T>& c, T* error) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // We compute the circumcenter using the intersection of the perpendicular
  // bisectors of AB and BC.  The formula is essentially
  //
  //    Z = ((A x B) x (A + B)) x ((B x C) x (B + C)),
  //
  // except that we compute the cross product (A x B) as (A - B) x (A + B)
  // (and similarly for B x C) since this is much more stable when the inputs
  // are unit vectors.
  Vector3<T> ab_diff = a - b, ab_sum = a + b;
  Vector3<T> bc_diff = b - c, bc_sum = b + c;
  Vector3<T> nab = ab_diff.CrossProd(ab_sum);
  T nab_len = nab.Norm();
  T ab_len = ab_diff.Norm();
  Vector3<T> nbc = bc_diff.CrossProd(bc_sum);
  T nbc_len = nbc.Norm();
  T bc_len = bc_diff.Norm();
  Vector3<T> mab = nab.CrossProd(ab_sum);
  Vector3<T> mbc = nbc.CrossProd(bc_sum);
  *error = (((16 + 24 * sqrt(3)) * T_ERR +
                8 * DBL_ERR * (ab_len + bc_len)) * nab_len * nbc_len +
               128 * sqrt(3) * DBL_ERR * T_ERR * (nab_len + nbc_len) +
               3 * 4096 * DBL_ERR * DBL_ERR * T_ERR * T_ERR);
  return mab.CrossProd(mbc);
}